

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::extractClassName(string *classOrQualifiedMethodName)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  size_t penultimateColons;
  size_t lastColons;
  string *className;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  allocator local_39;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"&",&local_39);
  bVar1 = startsWith(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    std::__cxx11::string::rfind((char *)in_RDI,0x1dbf8f);
    std::__cxx11::string::rfind((char *)in_RDI,0x1dbf8f);
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,(string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  return in_RDI;
}

Assistant:

inline std::string extractClassName( std::string const& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( startsWith( className, "&" ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }